

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_over_ip.cpp
# Opt level: O2

bool __thiscall
cppcms::impl::cache_over_ip::fetch
          (cache_over_ip *this,string *key,string *a,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,time_t *timeout_out,uint64_t *gen)

{
  base_cache *pbVar1;
  int iVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tags_00;
  tcp_cache *ptVar3;
  time_t *timeout;
  uint64_t *generation_00;
  string *a_00;
  bool bVar4;
  uint64_t generation;
  time_t tmp_timeout;
  string buffer;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp_triggers;
  uint64_t local_90;
  time_t local_88;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  a_00 = &local_80;
  if (a != (string *)0x0) {
    a_00 = a;
  }
  timeout = &local_88;
  if (timeout_out != (time_t *)0x0) {
    timeout = timeout_out;
  }
  generation_00 = &local_90;
  if (gen != (uint64_t *)0x0) {
    generation_00 = gen;
  }
  pbVar1 = (this->l1_).p_;
  if (pbVar1 == (base_cache *)0x0) {
    ptVar3 = tcp(this);
    iVar2 = tcp_cache::fetch(ptVar3,key,a_00,tags,timeout,generation_00,false);
    bVar4 = iVar2 == 1;
    goto LAB_00251e10;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  tags_00 = &local_60;
  if (tags != (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    tags_00 = &tags->_M_t;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar2 = (**pbVar1->_vptr_base_cache)(pbVar1,key,a_00,tags_00,timeout,generation_00);
  if ((char)iVar2 == '\0') {
    ptVar3 = tcp(this);
    iVar2 = tcp_cache::fetch(ptVar3,key,a_00,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)tags_00,timeout,generation_00,false);
    if (iVar2 == 1) {
      pbVar1 = (this->l1_).p_;
      bVar4 = true;
      (*pbVar1->_vptr_base_cache[1])(pbVar1,key,a_00,tags_00,*timeout,generation_00);
    }
    else {
LAB_00251deb:
      bVar4 = false;
    }
  }
  else {
    ptVar3 = tcp(this);
    iVar2 = tcp_cache::fetch(ptVar3,key,a_00,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)tags_00,timeout,generation_00,true);
    bVar4 = true;
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        (*((this->l1_).p_)->_vptr_base_cache[3])();
        goto LAB_00251deb;
      }
      pbVar1 = (this->l1_).p_;
      (*pbVar1->_vptr_base_cache[1])(pbVar1,key,a_00,tags_00,*timeout,generation_00);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
LAB_00251e10:
  std::__cxx11::string::~string((string *)&local_80);
  return bVar4;
}

Assistant:

bool fetch(	std::string const &key,
				std::string *a,std::set<std::string> *tags,
				time_t *timeout_out,
				uint64_t *gen)
		{
			std::string buffer;
			if(!a) a=&buffer;
			time_t tmp_timeout;
			if(!timeout_out) timeout_out=&tmp_timeout;
			uint64_t generation;
			if(!gen) gen=&generation;

			if(!l1_.get()) {
				if(tcp()->fetch(key,*a,tags,*timeout_out,*gen,false)==tcp_cache::found)
					return true;
				return false;
			}

			std::set<std::string> tmp_triggers;

			if(!tags) tags=&tmp_triggers;
			
			if(l1_->fetch(key,a,tags,timeout_out,gen)) {
				int res = tcp()->fetch(key,*a,tags,*timeout_out,*gen,true);
				if(res==tcp_cache::up_to_date)
					return true;
				if(res==tcp_cache::not_found) {
					l1_->remove(key);
					return false;
				}
				l1_->store(key,*a,*tags,*timeout_out,gen);
				return true;
			}
			else {
				if(tcp()->fetch(key,*a,tags,*timeout_out,*gen,false)==tcp_cache::found) {
					l1_->store(key,*a,*tags,*timeout_out,gen);
					return true;
				}
				return false;
			}
		}